

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int handle_subfield(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset,
                   size_t parent_offset,FMTypeDesc *t)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *__s;
  size_t sVar4;
  estate in_RCX;
  FMFormat_conflict in_RDX;
  FMFormat in_RSI;
  long *in_RDI;
  size_t in_R8;
  FMTypeDesc *in_R9;
  FMFormat_conflict subformat;
  int field_index;
  size_t element_offset;
  size_t tmp;
  int field;
  _FMgetFieldStruct src_spec_2;
  FMTypeDesc *next;
  size_t element_size_1;
  size_t i;
  size_t elements;
  size_t str_offset;
  size_t size_1;
  char *ptr_value_1;
  _FMgetFieldStruct src_spec_1;
  subsample_marshal_data smd;
  cod_exec_context ec;
  size_t element_count;
  size_t element_size;
  ssize_t previous_offset;
  field_marshal_info_conflict marshal_info;
  char *ptr_value;
  size_t tmp_data_loc;
  size_t new_offset;
  size_t size;
  _FMgetFieldStruct src_spec;
  FMTypeDesc *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  estate in_stack_fffffffffffffec0;
  estate in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  FFSBuffer in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  FMdata_type in_stack_fffffffffffffee4;
  estate in_stack_fffffffffffffee8;
  FFSBuffer in_stack_fffffffffffffef0;
  FMFormat_conflict in_stack_fffffffffffffef8;
  ulong local_100;
  ulong local_f8;
  size_t local_f0;
  _FMgetFieldStruct local_d8;
  undefined4 local_c0;
  size_t local_b8;
  void *local_b0;
  long local_a8;
  int local_a0;
  cod_exec_context local_98;
  ulong local_90;
  size_t local_88;
  size_t local_80;
  field_marshal_info_conflict local_78;
  void *local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  undefined1 local_50 [8];
  int local_48;
  FMTypeDesc *in_stack_ffffffffffffffc0;
  FMTypeDesc *parent_offset_00;
  
  uVar3 = (ulong)in_R9->type;
  switch(uVar3) {
  case 0:
    memset(local_50,0,0x18);
    iVar2 = (int)(uVar3 >> 0x20);
    local_48 = in_RSI->pointer_size;
    local_70 = quick_get_pointer((FMFieldPtr)local_50,(void *)((long)&in_RCX->copy_all + *in_RDI));
    if (local_70 == (void *)0x0) {
      return 1;
    }
    local_78 = get_marshal_info(in_RSI,in_R9);
    if (((local_78 != (field_marshal_info_conflict)0x0) && (local_78->type == FFSDropField)) &&
       (iVar1 = (*local_78->drop_row_func)(*(void **)&in_RDX->variant), iVar1 != 0)) {
      quick_put_ulong((FMFieldPtr)local_50,0,(void *)((long)&in_RCX->copy_all + *in_RDI));
      return 1;
    }
    if (in_RSI->recursive != 0) {
      local_80 = search_addr_list((estate)in_RDX,local_70);
      if (local_80 != 0xffffffffffffffff) {
        quick_put_ulong((FMFieldPtr)local_50,local_80,(void *)((long)&in_RCX->copy_all + *in_RDI));
        return 1;
      }
      local_80 = 0xffffffffffffffff;
    }
    local_58 = determine_size(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              (size_t)in_stack_fffffffffffffee8,
                              (FMTypeDesc *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (local_58 != 0) {
      if ((local_78 == (field_marshal_info_conflict)0x0) ||
         (local_78->type != FFSSubsampleArrayField)) {
        if ((in_RDX->ref_count == 0) &&
           (iVar2 = field_is_flat((FMFormat_conflict)
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                  in_stack_fffffffffffffeb0), iVar2 != 0)) {
          local_60 = add_data_iovec((estate)CONCAT44(in_stack_fffffffffffffed4,
                                                     in_stack_fffffffffffffed0),
                                    (FFSBuffer)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                    (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        }
        else {
          iVar2 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
          if (*(int *)&(in_RDX->server_ID).field_0x4 == 0) {
            local_60 = copy_data_to_tmp((estate)CONCAT44(in_stack_fffffffffffffee4,
                                                         in_stack_fffffffffffffee0),
                                        in_stack_fffffffffffffed8,
                                        (void *)CONCAT44(in_stack_fffffffffffffed4,
                                                         in_stack_fffffffffffffed0),
                                        (size_t)in_stack_fffffffffffffec8,iVar2,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ));
          }
          else {
            local_60 = reserve_space_for_data_in_tmp
                                 ((estate)CONCAT44(in_stack_fffffffffffffee4,
                                                   in_stack_fffffffffffffee0),
                                  in_stack_fffffffffffffed8,
                                  (void *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),
                                  (size_t)in_stack_fffffffffffffec8,iVar2,
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          }
        }
      }
      else {
        local_88 = determine_size(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                  (size_t)in_stack_fffffffffffffee8,
                                  (FMTypeDesc *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        local_90 = local_58 / local_88;
        local_98 = local_78->ec;
        local_60 = allocate_tmp_space(in_stack_fffffffffffffee8,
                                      (FFSBuffer)
                                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                      (size_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                                      (size_t *)in_stack_fffffffffffffec8);
        local_c0 = (undefined4)local_90;
        local_b8 = local_88;
        local_b0 = local_70;
        local_a8 = *in_RDI + local_60;
        local_a0 = 0;
        cod_assoc_client_data((cod_exec_context)in_stack_fffffffffffffeb0,iVar2,0x110b34);
        (*local_78->subsample_array_func)(local_98,*(void **)&in_RDX->variant,(int)local_90);
        set_dynamic_array_size
                  ((FMFormat_conflict)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8,
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (FMTypeDesc *)in_stack_fffffffffffffec8,
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        if (local_58 != 0) {
          (*(internal_iovec **)&in_RDX->format_index)[*(int *)((long)&in_RDX->format_name + 4)].
          iov_len = (long)local_a0 * local_88;
          (*(internal_iovec **)&in_RDX->format_index)[*(int *)((long)&in_RDX->format_name + 4)].
          iov_offset = local_68;
          (*(internal_iovec **)&in_RDX->format_index)[*(int *)((long)&in_RDX->format_name + 4)].
          iov_base = (void *)0x0;
          *(int *)((long)&in_RDX->format_name + 4) = *(int *)((long)&in_RDX->format_name + 4) + 1;
        }
        in_RDX->context =
             (FMContext_conflict)((long)in_RDX->context - (local_58 - (long)local_a0 * local_88));
        in_RDI[2] = in_RDI[2] - (local_58 - (long)local_a0 * local_88);
      }
      quick_put_ulong((FMFieldPtr)local_50,local_60 - *(long *)&in_RDX->IOversion,
                      (void *)((long)&in_RCX->copy_all + *in_RDI));
      if (in_RSI->recursive != 0) {
        add_to_addr_list(in_stack_fffffffffffffec0,
                         (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (size_t)in_stack_fffffffffffffeb0);
      }
      iVar2 = field_is_flat((FMFormat_conflict)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            in_stack_fffffffffffffeb0);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = handle_subfield((FFSBuffer)in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,
                              in_stack_ffffffffffffffc0);
      return iVar2;
    }
    quick_put_ulong((FMFieldPtr)local_50,0,(void *)((long)&in_RCX->copy_all + *in_RDI));
    return 1;
  case 1:
    local_f8 = 1;
    parent_offset_00 = in_R9;
    for (; in_R9->type == FMType_array; in_R9 = in_R9->next) {
      if (in_R9->static_size == 0) {
        iVar2 = in_R9->control_field_index;
        memset(&stack0xfffffffffffffed8,0,0x18);
        in_stack_fffffffffffffee0 = in_RSI->field_list[iVar2].field_size;
        sVar4 = quick_get_ulong((FMFieldPtr)&stack0xfffffffffffffed8,(void *)(*in_RDI + in_R8));
      }
      else {
        sVar4 = (size_t)in_R9->static_size;
      }
      local_f8 = local_f8 * sVar4;
    }
    determine_size(in_stack_fffffffffffffef8,(FFSBuffer)in_R9,(size_t)in_stack_fffffffffffffee8,
                   (FMTypeDesc *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    iVar2 = field_is_flat((FMFormat_conflict)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                          in_stack_fffffffffffffeb0);
    if (iVar2 != 0) {
      return 1;
    }
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      iVar2 = handle_subfield((FFSBuffer)in_RSI,in_RDX,in_RCX,in_R8,(size_t)parent_offset_00,
                              in_stack_ffffffffffffffc0);
      if (iVar2 == 0) {
        return 0;
      }
    }
    break;
  case 2:
    memset(&local_d8,0,0x18);
    iVar2 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    local_d8.size = in_RSI->pointer_size;
    __s = (char *)quick_get_pointer(&local_d8,(void *)((long)&in_RCX->copy_all + *in_RDI));
    if (__s == (char *)0x0) {
      return 1;
    }
    strlen(__s);
    if (in_RDX->ref_count == 0) {
      local_f0 = add_data_iovec((estate)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                ),(FFSBuffer)in_stack_fffffffffffffec8,
                                in_stack_fffffffffffffec0,
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),iVar2)
      ;
    }
    else {
      local_f0 = copy_data_to_tmp((estate)CONCAT44(in_stack_fffffffffffffee4,
                                                   in_stack_fffffffffffffee0),
                                  in_stack_fffffffffffffed8,
                                  (void *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),
                                  (size_t)in_stack_fffffffffffffec8,
                                  (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (local_f0 == 0xffffffffffffffff) {
        return 0;
      }
    }
    quick_put_ulong(&local_d8,local_f0 - *(long *)&in_RDX->IOversion,
                    (void *)((long)&in_RCX->copy_all + *in_RDI));
    break;
  case 3:
    iVar2 = handle_subfields(in_stack_fffffffffffffed8,
                             (FMFormat_conflict)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    return iVar2;
  }
  return 1;
}

Assistant:

static int
handle_subfield(FFSBuffer buf, FMFormat f, estate s, size_t data_offset, size_t parent_offset, FMTypeDesc *t)
{

    switch (t->type) {
    case FMType_pointer:
    {
	struct _FMgetFieldStruct src_spec;
	size_t size, new_offset, tmp_data_loc;
	char *ptr_value;
	field_marshal_info marshal_info;

	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;

	/* customized marshalling */
	if ((marshal_info = get_marshal_info(f, t)) != NULL) {
	    if (marshal_info->type == FFSDropField) {
		if (marshal_info->drop_row_func(s->orig_data)) {
		    /* drop the value */
		    quick_put_ulong(&src_spec, 0,
				    (char*)buf->tmp_buffer + data_offset);
		    return 1;
		}
	    }
	}

	if (f->recursive) {
	    ssize_t previous_offset = search_addr_list(s, ptr_value);
	    if (previous_offset != (ssize_t)-1) {
		quick_put_ulong(&src_spec, previous_offset,
				(char*)buf->tmp_buffer + data_offset);
		return 1;
	    }
	}
	size = determine_size(f, buf, parent_offset, t->next);
	if (size == 0)  {
	    quick_put_ulong(&src_spec, 0,
			    (char*)buf->tmp_buffer + data_offset);
	    return 1;
	}
	if ((marshal_info == NULL) || (marshal_info->type != FFSSubsampleArrayField)) {
	    if (!s->copy_all && field_is_flat(f, t->next)) {
		/* leave data where it sits */
		new_offset = add_data_iovec(s, buf, ptr_value, size, 8);
	    } else {
		if (s->no_leaf_copy) {
		    /* this path only used for FFSencode_no_leaf_copy() */
		    new_offset = reserve_space_for_data_in_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		} else {
		    new_offset = copy_data_to_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		}
	    }
	} else {
	    /* can't leave data where it sits */
	    /* 1. allocate temporary space for the destination array
	       2. call function to fill destination with part of source
	       3. return value is number of elements copied
	       4. adjust size of temporary to reflect actual data copied
	    */
	    size_t element_size = determine_size(f, buf, parent_offset, t->next->next);
	    size_t element_count = size / element_size;
	    cod_exec_context ec = marshal_info->ec;
	    struct subsample_marshal_data smd;
	    new_offset = allocate_tmp_space(s, buf, size, 8, &tmp_data_loc);
	    smd.element_count = (int)element_count;
	    smd.element_size = element_size;
	    smd.src_ptr = ptr_value;
	    smd.dst_ptr = (char*)buf->tmp_buffer + new_offset;
	    smd.marshalled_count = 0;
#ifdef DO_DCG
	    cod_assoc_client_data(ec,  0x534d4450, (intptr_t)&smd);
#endif
	    marshal_info->subsample_array_func(ec, s->orig_data, (int)element_count);
	    /* fixup size */
	    set_dynamic_array_size(f, buf, parent_offset, t->next, 
				   smd.marshalled_count);
	    if (size != 0) {
		s->iovec[s->iovcnt].iov_len = smd.marshalled_count * element_size;
		s->iovec[s->iovcnt].iov_offset = tmp_data_loc;
		s->iovec[s->iovcnt].iov_base = NULL;
		s->iovcnt++;
	    }
	    s->output_len -= (size - (smd.marshalled_count *element_size));
	    buf->tmp_buffer_in_use_size -= (size - (smd.marshalled_count *element_size));
	}
	quick_put_ulong(&src_spec, new_offset - s->saved_offset_difference, 
			(char*)buf->tmp_buffer + data_offset);
	if (f->recursive) {
	    add_to_addr_list(s, ptr_value, new_offset - s->saved_offset_difference);
	}
	if (field_is_flat(f, t->next)) return 1;
	return handle_subfield(buf, f, s, tmp_data_loc, parent_offset, t->next);
    }
    case FMType_string:
    {
	struct _FMgetFieldStruct src_spec;
	char *ptr_value;
	size_t size, str_offset;
	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;
	size = strlen(ptr_value) + 1;
	if (!s->copy_all) {
	    /* leave data where it sits */
	    str_offset = add_data_iovec(s, buf, ptr_value, size, 1);
	} else {
	    str_offset = copy_data_to_tmp(s, buf, ptr_value, size, 1, NULL);
	    if (str_offset == (size_t) -1) return 0;
	}
	quick_put_ulong(&src_spec, str_offset - s->saved_offset_difference,
			(char*)buf->tmp_buffer + data_offset);
	break;
    }
    case FMType_array:
    {
	size_t elements = 1, i;
	size_t element_size;
	FMTypeDesc *next = t;
	while (next->type == FMType_array) {
	    if (next->static_size == 0) {
		struct _FMgetFieldStruct src_spec;
		int field = next->control_field_index;
		memset(&src_spec, 0, sizeof(src_spec));
		src_spec.size = f->field_list[field].field_size;
		src_spec.offset = f->field_list[field].field_offset;
		size_t tmp = quick_get_ulong(&src_spec, (char*)buf->tmp_buffer + parent_offset);
		elements = elements * tmp;
	    } else {
		elements = elements * next->static_size;
	    }
	    next = next->next;
	}
	element_size = determine_size(f, buf, parent_offset, next);
	if (field_is_flat(f, next)) return 1;
	for (i = 0; i < elements ; i++) {
	    size_t element_offset = data_offset + i * element_size;
	    if (!handle_subfield(buf, f, s, element_offset, parent_offset, next)) return 0;
	}
	break;
    }
    case FMType_subformat:
    {
	int field_index = t->field_index;
	FMFormat subformat = f->field_subformats[field_index];
	return handle_subfields(buf, subformat, s, data_offset);
    }
    default:
	assert(0);
    }
    return 1;
}